

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Common_v2.cpp
# Opt level: O3

error<idx2::idx2_err_code> idx2::Finalize(idx2_file_v2 *Idx2)

{
  array<idx2::array<signed_char>_> *Array;
  undefined4 *puVar1;
  long *plVar2;
  byte bVar3;
  byte *pbVar4;
  str pcVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  byte *pbVar11;
  long lVar12;
  char cVar13;
  long lVar14;
  idx2_err_code iVar15;
  long lVar16;
  undefined8 uVar17;
  int iVar18;
  ulong uVar19;
  undefined8 *puVar20;
  uint uVar21;
  long lVar22;
  size_t __maxlen;
  long lVar23;
  char *__s;
  char *pcVar24;
  long *in_FS_OFFSET;
  error<idx2::idx2_err_code> eVar25;
  int aiStackY_248 [100];
  undefined4 uVar26;
  undefined8 *local_a8;
  undefined4 *local_a0;
  undefined8 local_98;
  char *local_90;
  array<signed_char> local_88;
  array<signed_char> *local_50;
  int local_48 [6];
  
  lVar16 = (Idx2->Dimensions).Size;
  if (lVar16 != 0) {
    pbVar11 = (Idx2->Dimensions).Buffer.Data;
    lVar22 = 0;
    do {
      lVar23 = *(long *)(pbVar11 + lVar22 + 0x18);
      if (lVar23 == 0) {
        iVar9 = *(int *)(pbVar11 + lVar22 + 0x30);
        if (iVar9 == 0) {
          local_a8 = (undefined8 *)(*in_FS_OFFSET + -0x300);
          *local_a8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
          ;
          local_a0 = (undefined4 *)(*in_FS_OFFSET + -0x100);
          *local_a0 = 0x36;
          lVar16 = 0x10;
          goto LAB_001063dc;
        }
LAB_00105e73:
        if (iVar9 == 1) {
LAB_001061cc:
          local_a8 = (undefined8 *)(*in_FS_OFFSET + -0x300);
          *local_a8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
          ;
          local_a0 = (undefined4 *)(*in_FS_OFFSET + -0x100);
          *local_a0 = 0x3a;
          lVar16 = 0x10;
          goto LAB_0010620b;
        }
      }
      else {
        iVar9 = *(int *)(pbVar11 + lVar22 + 0x30);
        if (lVar23 < 1) goto LAB_00105e73;
        if (0 < iVar9) {
          local_a8 = (undefined8 *)(*in_FS_OFFSET + -0x300);
          *local_a8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
          ;
          local_a0 = (undefined4 *)(*in_FS_OFFSET + -0x100);
          *local_a0 = 0x38;
          lVar16 = 0x10;
          goto LAB_001062f3;
        }
        if (lVar23 == 1) goto LAB_001061cc;
      }
      lVar22 = lVar22 + 0x38;
    } while (lVar16 * 0x38 - lVar22 != 0);
  }
  lVar16 = *in_FS_OFFSET;
  puVar20 = (undefined8 *)(lVar16 + -0x300);
  *puVar20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
  ;
  lVar22 = *in_FS_OFFSET;
  puVar1 = (undefined4 *)(lVar22 + -0x100);
  *puVar1 = 0x3d;
  if (Mallocator()::Instance == '\0') {
    Finalize();
  }
  if (Mallocator()::Instance == '\0') {
    Finalize();
  }
  local_88.Buffer.Data = (byte *)0x0;
  local_88.Buffer.Bytes = 0;
  local_88.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
  local_88.Size = 0;
  local_88.Capacity = 0;
  local_88.Alloc = (allocator *)&Mallocator()::Instance;
  lVar23 = (long)(Idx2->IdxTemplate).Full.Size;
  if (0 < lVar23) {
    Array = &(Idx2->IdxTemplate).Suffix;
    local_50 = &(Idx2->IdxTemplate).Prefix;
    bVar7 = true;
    do {
      if ((Idx2->IdxTemplate).Full.Size < lVar23) {
        __assert_fail("Idx < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/../String.h"
                      ,0x9b,"char &idx2::stref::operator[](int) const");
      }
      bVar3 = (Idx2->IdxTemplate).Full.field_0.Ptr[lVar23 + -1];
      if (bVar3 == '|') {
        if (!bVar7) {
          *puVar20 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
          ;
          *puVar1 = 0x5a;
          lVar23 = 0x10;
          goto LAB_00106961;
        }
        lVar12 = (Idx2->IdxTemplate).Suffix.Size;
        if ((Idx2->IdxTemplate).Suffix.Capacity <= lVar12) {
          GrowCapacity<idx2::array<signed_char>>(Array,0);
          lVar12 = (Idx2->IdxTemplate).Suffix.Size;
        }
        (Idx2->IdxTemplate).Suffix.Size = lVar12 + 1;
        pbVar4 = (Idx2->IdxTemplate).Suffix.Buffer.Data;
        pbVar11 = pbVar4 + lVar12 * 0x30 + 0x10;
        *(allocator **)pbVar11 = local_88.Buffer.Alloc;
        *(i64 *)(pbVar11 + 8) = local_88.Size;
        *(i64 *)(pbVar11 + 0x10) = local_88.Capacity;
        *(allocator **)(pbVar11 + 0x18) = local_88.Alloc;
        plVar2 = (long *)(pbVar4 + lVar12 * 0x30);
        *plVar2 = (long)local_88.Buffer.Data;
        plVar2[1] = local_88.Buffer.Bytes;
        plVar2[2] = (long)local_88.Buffer.Alloc;
        plVar2[3] = local_88.Size;
        if (Mallocator()::Instance == '\0') {
          Finalize();
        }
        if (Mallocator()::Instance == '\0') {
          Finalize();
        }
        local_88.Buffer.Data = (byte *)0x0;
        local_88.Buffer.Bytes = 0;
        local_88.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
        local_88.Size = 0;
        local_88.Capacity = 0;
        local_88.Alloc = (allocator *)&Mallocator()::Instance;
        bVar7 = false;
      }
      else if (bVar3 == ':') {
        if (!bVar7) {
          *puVar20 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
          ;
          *puVar1 = 0x52;
          lVar23 = 0x10;
          goto LAB_001069a5;
        }
        lVar12 = (Idx2->IdxTemplate).Suffix.Size;
        if ((Idx2->IdxTemplate).Suffix.Capacity <= lVar12) {
          GrowCapacity<idx2::array<signed_char>>(Array,0);
          lVar12 = (Idx2->IdxTemplate).Suffix.Size;
        }
        (Idx2->IdxTemplate).Suffix.Size = lVar12 + 1;
        pbVar4 = (Idx2->IdxTemplate).Suffix.Buffer.Data;
        pbVar11 = pbVar4 + lVar12 * 0x30 + 0x10;
        *(allocator **)pbVar11 = local_88.Buffer.Alloc;
        *(i64 *)(pbVar11 + 8) = local_88.Size;
        *(i64 *)(pbVar11 + 0x10) = local_88.Capacity;
        *(allocator **)(pbVar11 + 0x18) = local_88.Alloc;
        plVar2 = (long *)(pbVar4 + lVar12 * 0x30);
        *plVar2 = (long)local_88.Buffer.Data;
        plVar2[1] = local_88.Buffer.Bytes;
        plVar2[2] = (long)local_88.Buffer.Alloc;
        plVar2[3] = local_88.Size;
        if (Mallocator()::Instance == '\0') {
          Finalize();
        }
        if (Mallocator()::Instance == '\0') {
          Finalize();
        }
        local_88.Buffer.Data = (byte *)0x0;
        local_88.Buffer.Bytes = 0;
        local_88.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
        local_88.Size = 0;
        local_88.Capacity = 0;
        local_88.Alloc = (allocator *)&Mallocator()::Instance;
      }
      else {
        uVar21 = (uint)(char)bVar3;
        iVar9 = isalpha(uVar21);
        if ((iVar9 == 0) || (iVar9 = islower(uVar21), iVar9 == 0)) {
          *puVar20 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
          ;
          *puVar1 = 100;
          lVar23 = 0x10;
          goto LAB_001066bb;
        }
        bVar8 = Idx2->CharToIntMap[(long)(char)bVar3 + -0x61];
        if (bVar8 == 0xff) {
          lVar12 = (Idx2->Dimensions).Size;
          if (0 < lVar12) {
            pbVar11 = (Idx2->Dimensions).Buffer.Data + 0x34;
            lVar14 = 0;
            while (bVar3 != *pbVar11) {
              lVar14 = lVar14 + -1;
              pbVar11 = pbVar11 + 0x38;
              if (-lVar14 == lVar12) goto LAB_00106222;
            }
            bVar8 = -(char)lVar14;
            Idx2->CharToIntMap[(long)(char)bVar3 + -0x61] = bVar8;
            if ((char)lVar14 != '\x01') goto LAB_001060f3;
          }
LAB_00106222:
          *puVar20 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
          ;
          *puVar1 = 0x78;
          lVar23 = 0x10;
          goto LAB_00106248;
        }
LAB_001060f3:
        if (bVar7) {
          lVar12 = local_88.Size;
          if (local_88.Capacity <= local_88.Size) {
            GrowCapacity<signed_char>(&local_88,0);
            bVar8 = Idx2->CharToIntMap[(long)(char)bVar3 + -0x61];
            lVar12 = local_88.Size;
          }
          local_88.Size = lVar12 + 1;
          pbVar11 = local_88.Buffer.Data;
        }
        else {
          lVar12 = (Idx2->IdxTemplate).Prefix.Size;
          if ((Idx2->IdxTemplate).Prefix.Capacity <= lVar12) {
            GrowCapacity<signed_char>(local_50,0);
            bVar8 = Idx2->CharToIntMap[(long)(char)bVar3 + -0x61];
            lVar12 = (Idx2->IdxTemplate).Prefix.Size;
          }
          (Idx2->IdxTemplate).Prefix.Size = lVar12 + 1;
          pbVar11 = (Idx2->IdxTemplate).Prefix.Buffer.Data;
        }
        pbVar11[lVar12] = bVar8;
      }
      bVar6 = 1 < lVar23;
      lVar23 = lVar23 + -1;
    } while (bVar6);
    if (0 < local_88.Size) {
      lVar23 = (Idx2->IdxTemplate).Suffix.Size;
      if ((Idx2->IdxTemplate).Suffix.Capacity <= lVar23) {
        GrowCapacity<idx2::array<signed_char>>(Array,0);
        lVar23 = (Idx2->IdxTemplate).Suffix.Size;
      }
      (Idx2->IdxTemplate).Suffix.Size = lVar23 + 1;
      pbVar4 = (Idx2->IdxTemplate).Suffix.Buffer.Data;
      pbVar11 = pbVar4 + lVar23 * 0x30 + 0x10;
      *(allocator **)pbVar11 = local_88.Buffer.Alloc;
      *(i64 *)(pbVar11 + 8) = local_88.Size;
      *(i64 *)(pbVar11 + 0x10) = local_88.Capacity;
      *(allocator **)(pbVar11 + 0x18) = local_88.Alloc;
      plVar2 = (long *)(pbVar4 + lVar23 * 0x30);
      *plVar2 = (long)local_88.Buffer.Data;
      plVar2[1] = local_88.Buffer.Bytes;
      plVar2[2] = (long)local_88.Buffer.Alloc;
      plVar2[3] = local_88.Size;
      if (0 < (Idx2->IdxTemplate).Prefix.Size) {
        *puVar20 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
        ;
        *puVar1 = 0x87;
        lVar23 = 0x10;
        do {
          if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) == '\x1e') {
            cVar13 = '\x1e';
            goto LAB_00106b22;
          }
          lVar23 = lVar23 + 0x18;
        } while (lVar23 != 0x3b8);
        cVar13 = '\'';
LAB_00106b22:
        lVar23 = 0x10;
        do {
          if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) == cVar13) {
            lVar12 = *in_FS_OFFSET;
            iVar9 = snprintf((char *)(lVar12 + -0x700),0x400,"%.*s (file %s, line %d): ",
                             (ulong)*(uint *)(&action_s::NameMap + lVar23),
                             *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar23),
                             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                             ,0x87);
            lVar23 = (long)iVar9;
            pcVar24 = (char *)(lVar12 + -0x700) + lVar23;
            local_90 = "Invalid indexing template syntax\n";
            goto LAB_00106f6c;
          }
          lVar23 = lVar23 + 0x18;
        } while (lVar23 != 0x3b8);
        goto LAB_00106fc3;
      }
    }
  }
  lVar23 = (Idx2->Dimensions).Size;
  if (0 < lVar23) {
    lVar12 = *in_FS_OFFSET;
    pbVar11 = (Idx2->Dimensions).Buffer.Data + 0x34;
    lVar14 = lVar23;
    do {
      bVar3 = *pbVar11;
      if (Idx2->CharToIntMap[(long)(char)bVar3 - 0x61] == -1) {
        *puVar20 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
        ;
        *puVar1 = 0x8f;
        lVar23 = 0x10;
        goto LAB_00106677;
      }
      pbVar11 = pbVar11 + 0x38;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
  }
  lVar12 = (Idx2->IdxTemplate).Suffix.Size;
  if (0 < lVar12) {
    pbVar11 = (Idx2->IdxTemplate).Suffix.Buffer.Data;
    do {
      lVar14 = *(long *)(pbVar11 + 0x18);
      if (3 < lVar14) {
        *puVar20 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
        ;
        *puVar1 = 0x97;
        lVar23 = 0x10;
        goto LAB_0010688b;
      }
      if (lVar14 == 2) {
        if (**(char **)pbVar11 == (*(char **)pbVar11)[1]) {
          *puVar20 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
          ;
          *puVar1 = 0x9c;
          lVar23 = 0x10;
          goto LAB_00106d49;
        }
      }
      else if (lVar14 == 3) {
        pcVar24 = *(char **)pbVar11;
        if (((*pcVar24 == pcVar24[1]) || (*pcVar24 == pcVar24[2])) || (pcVar24[1] == pcVar24[2])) {
          *puVar20 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
          ;
          *puVar1 = 0x9f;
          lVar23 = 0x10;
          goto LAB_001069e4;
        }
      }
      else if (lVar14 == 0) {
        *puVar20 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
        ;
        *puVar1 = 0x99;
        lVar23 = 0x10;
        goto LAB_00106cc4;
      }
      pbVar11 = pbVar11 + 0x30;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  local_48[0] = 1;
  local_48[1] = 1;
  local_48[2] = 1;
  local_48[3] = 1;
  local_48[4] = 1;
  local_48[5] = 1;
  lVar12 = (long)(Idx2->IdxTemplate).Full.Size;
  if (0 < lVar12) {
    pcVar5 = (Idx2->IdxTemplate).Full.field_0.Ptr;
    lVar14 = 0;
    do {
      iVar18 = (int)pcVar5[lVar14];
      iVar9 = isalpha(iVar18);
      if (iVar9 != 0) {
        if (5 < (long)Idx2->CharToIntMap[(long)iVar18 + -0x61]) goto LAB_0010707f;
        local_48[Idx2->CharToIntMap[(long)iVar18 + -0x61]] =
             local_48[Idx2->CharToIntMap[(long)iVar18 + -0x61]] << 1;
      }
      lVar14 = lVar14 + 1;
    } while (lVar12 != lVar14);
  }
  if (0 < lVar23) {
    pbVar11 = (Idx2->Dimensions).Buffer.Data + 0x34;
    lVar12 = 0;
    do {
      uVar19 = *(ulong *)(pbVar11 + -0x1c);
      if ((long)uVar19 < 1) {
        uVar19 = (ulong)*(uint *)(pbVar11 + -4);
      }
      if ((int)uVar19 == 0) {
        iVar9 = 1;
      }
      else {
        uVar19 = (long)(int)uVar19 - 1;
        lVar14 = 0x3f;
        if (uVar19 != 0) {
          for (; uVar19 >> lVar14 == 0; lVar14 = lVar14 + -1) {
          }
        }
        iVar9 = (int)(1L << (-((byte)lVar14 ^ 0x3f) & 0x3f));
        if (uVar19 == 0) {
          iVar9 = 1;
        }
      }
      if (lVar12 == 6) {
LAB_0010707f:
        __assert_fail("Idx < 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/../Common.h"
                      ,0x2d0,"t &idx2::v6<int>::operator[](int) const [t = int]");
      }
      iVar18 = local_48[lVar12];
      uVar19 = (ulong)iVar18;
      if (iVar18 < iVar9) {
        *puVar20 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
        ;
        *puVar1 = 0xb6;
        lVar23 = 0x10;
        goto LAB_00106a28;
      }
      if (iVar9 < iVar18) {
        *puVar20 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
        ;
        *puVar1 = 0xbb;
        lVar23 = 0x10;
        goto LAB_00106a6c;
      }
      lVar12 = lVar12 + 1;
      pbVar11 = pbVar11 + 0x38;
    } while (lVar23 != lVar12);
  }
  *puVar20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
  ;
  *puVar1 = 0xca;
  local_90 = "";
  local_98 = 0;
LAB_00106f92:
  eVar25.Code = (char)local_98;
  eVar25.StackIdx = (char)((ulong)local_98 >> 8);
  eVar25.StrGened = (bool)(char)((ulong)local_98 >> 0x10);
  eVar25._11_5_ = (int5)((ulong)local_98 >> 0x18);
  eVar25.Msg = local_90;
  return eVar25;
  while (lVar16 = lVar16 + 0x18, lVar16 != 0x3b8) {
LAB_001062f3:
    if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16) == '\x13') {
      iVar15 = DimensionsRepeated;
      goto LAB_001066db;
    }
  }
  iVar15 = __Invalid__;
LAB_001066db:
  lVar16 = 0;
  do {
    if ((&idx2_err_code_s::NameMap.Arr[0].ItemVal)[lVar16] == iVar15) {
      puVar20 = (undefined8 *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16);
      local_98 = 0x10113;
      local_90 = "Dimension %c is both numerical and categorical\n";
      uVar26 = 0x38;
      goto LAB_0010676d;
    }
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x3a8);
  goto LAB_00106fc3;
  while (lVar16 = lVar16 + 0x18, lVar16 != 0x3b8) {
LAB_001063dc:
    if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16) == '\x02') {
      iVar15 = SizeZero;
      goto LAB_00106726;
    }
  }
  iVar15 = __Invalid__;
LAB_00106726:
  lVar16 = 0;
  do {
    if ((&idx2_err_code_s::NameMap.Arr[0].ItemVal)[lVar16] == iVar15) {
      puVar20 = (undefined8 *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16);
      local_98 = 0x10102;
      local_90 = "Dimension %c is zero\n";
      uVar26 = 0x36;
      goto LAB_0010676d;
    }
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x3a8);
  goto LAB_00106fc3;
  while (lVar16 = lVar16 + 0x18, lVar16 != 0x3b8) {
LAB_0010620b:
    if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16) == '\x14') {
      iVar15 = DimensionTooSmall;
      goto LAB_00106268;
    }
  }
  iVar15 = __Invalid__;
LAB_00106268:
  lVar16 = 0;
  do {
    if ((&idx2_err_code_s::NameMap.Arr[0].ItemVal)[lVar16] == iVar15) {
      puVar20 = (undefined8 *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16);
      local_98 = 0x10114;
      local_90 = "Dimension %c is too small (1), consider removing it\n";
      uVar26 = 0x3a;
LAB_0010676d:
      lVar16 = *in_FS_OFFSET;
      iVar9 = snprintf((char *)(lVar16 + -0x700),0x400,"%.*s (file %s, line %d): ",
                       (ulong)*(uint *)(puVar20 + 1),*puVar20,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                       ,uVar26);
      snprintf((char *)(lVar16 + -0x700) + iVar9,0x400 - (long)iVar9,local_90,
               (ulong)(uint)(int)(char)pbVar11[lVar22 + 0x34]);
      local_a0[1] = 0xc6;
      local_a8[1] = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
      ;
      goto LAB_00106f92;
    }
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x3a8);
  goto LAB_00106fc3;
  while (lVar23 = lVar23 + 0x18, lVar23 != 0x3b8) {
LAB_00106961:
    if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) == '\x1e') {
      cVar13 = '\x1e';
      goto LAB_00106ba2;
    }
  }
  cVar13 = '\'';
LAB_00106ba2:
  lVar23 = 0x10;
  do {
    if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) == cVar13) {
      lVar12 = *in_FS_OFFSET;
      iVar9 = snprintf((char *)(lVar12 + -0x700),0x400,"%.*s (file %s, line %d): ",
                       (ulong)*(uint *)(&action_s::NameMap + lVar23),
                       *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar23),
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                       ,0x5a);
      lVar23 = (long)iVar9;
      pcVar24 = (char *)(lVar12 + -0x700) + lVar23;
      local_90 = "Only one | allowed in the indexing template\n";
      goto LAB_00106f6c;
    }
    lVar23 = lVar23 + 0x18;
  } while (lVar23 != 0x3b8);
  goto LAB_00106fc3;
  while (lVar23 = lVar23 + 0x18, lVar23 != 0x3b8) {
LAB_00106248:
    if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) == '\x06') {
      cVar13 = '\x06';
      goto LAB_00106313;
    }
  }
  cVar13 = '\'';
LAB_00106313:
  lVar23 = 0x10;
  do {
    if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) == cVar13) {
      lVar12 = *in_FS_OFFSET;
      iVar9 = snprintf((char *)(lVar12 + -0x700),0x400,"%.*s (file %s, line %d): ",
                       (ulong)*(uint *)(&action_s::NameMap + lVar23),
                       *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar23),
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                       ,0x78);
      __s = (char *)(lVar12 + -0x700) + iVar9;
      __maxlen = 0x400 - (long)iVar9;
      local_90 = "The indexing template contains an unknown dimension: %c\n";
      pcVar24 = "The indexing template contains an unknown dimension: %c\n";
      uVar19 = (ulong)uVar21;
      goto LAB_00106b0f;
    }
    lVar23 = lVar23 + 0x18;
  } while (lVar23 != 0x3b8);
  goto LAB_00106fc3;
  while (lVar23 = lVar23 + 0x18, lVar23 != 0x3b8) {
LAB_001066bb:
    if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) == '\x1e') {
      cVar13 = '\x1e';
      goto LAB_001068ab;
    }
  }
  cVar13 = '\'';
LAB_001068ab:
  lVar23 = 0x10;
  do {
    if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) == cVar13) {
      lVar12 = *in_FS_OFFSET;
      iVar9 = snprintf((char *)(lVar12 + -0x700),0x400,"%.*s (file %s, line %d): ",
                       (ulong)*(uint *)(&action_s::NameMap + lVar23),
                       *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar23),
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                       ,100);
      local_90 = "Unsupported character (%c) in the indexing template\n";
      snprintf((char *)(lVar12 + -0x700) + iVar9,0x400 - (long)iVar9,
               "Unsupported character (%c) in the indexing template\n",uVar21);
      goto LAB_00106f76;
    }
    lVar23 = lVar23 + 0x18;
  } while (lVar23 != 0x3b8);
  goto LAB_00106fc3;
  while (lVar23 = lVar23 + 0x18, lVar23 != 0x3b8) {
LAB_001069a5:
    if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) == '\x1e') {
      cVar13 = '\x1e';
      goto LAB_00106c1f;
    }
  }
  cVar13 = '\'';
LAB_00106c1f:
  lVar23 = 0x10;
  do {
    if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) == cVar13) {
      lVar12 = *in_FS_OFFSET;
      iVar9 = snprintf((char *)(lVar12 + -0x700),0x400,"%.*s (file %s, line %d): ",
                       (ulong)*(uint *)(&action_s::NameMap + lVar23),
                       *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar23),
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                       ,0x52);
      lVar23 = (long)iVar9;
      pcVar24 = (char *)(lVar12 + -0x700) + lVar23;
      local_90 = ": cannot occur after | in the indexing template\n";
      goto LAB_00106f6c;
    }
    lVar23 = lVar23 + 0x18;
  } while (lVar23 != 0x3b8);
  goto LAB_00106fc3;
  while (lVar23 = lVar23 + 0x18, lVar23 != 0x3b8) {
LAB_00106677:
    if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) == '\x06') {
      cVar13 = '\x06';
      goto LAB_001067f9;
    }
  }
  cVar13 = '\'';
LAB_001067f9:
  lVar23 = 0x10;
  do {
    if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) == cVar13) {
      iVar9 = snprintf((char *)(lVar12 + -0x700),0x400,"%.*s (file %s, line %d): ",
                       (ulong)*(uint *)(&action_s::NameMap + lVar23),
                       *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar23),
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                       ,0x8f);
      __s = (char *)(lVar12 + -0x700) + iVar9;
      __maxlen = 0x400 - (long)iVar9;
      local_90 = "Dimension %c does not appear in the indexing template\n";
      pcVar24 = "Dimension %c does not appear in the indexing template\n";
      uVar19 = (long)(char)bVar3 & 0xffffffff;
      goto LAB_00106b0f;
    }
    lVar23 = lVar23 + 0x18;
  } while (lVar23 != 0x3b8);
  goto LAB_00106fc3;
  while (lVar23 = lVar23 + 0x18, lVar23 != 0x3b8) {
LAB_0010688b:
    if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) == '\x06') {
      cVar13 = '\x06';
      goto LAB_00106a8c;
    }
  }
  cVar13 = '\'';
LAB_00106a8c:
  lVar23 = 0x10;
LAB_00106a91:
  if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) != cVar13)
  goto code_r0x00106a96;
  lVar12 = *in_FS_OFFSET;
  iVar9 = snprintf((char *)(lVar12 + -0x700),0x400,"%.*s (file %s, line %d): ",
                   (ulong)*(uint *)(&action_s::NameMap + lVar23),
                   *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar23),
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                   ,0x97);
  uVar19 = (ulong)iVar9;
  __s = (char *)(lVar12 + -0x700) + uVar19;
  __maxlen = 0x400 - uVar19;
  local_90 = "More than three dimensions in level %d\n";
  pcVar24 = "More than three dimensions in level %d\n";
LAB_00106b0f:
  snprintf(__s,__maxlen,pcVar24,uVar19);
  local_98 = 0x10106;
  goto LAB_00106f7b;
code_r0x00106a96:
  lVar23 = lVar23 + 0x18;
  if (lVar23 == 0x3b8) goto LAB_00106fc3;
  goto LAB_00106a91;
  while (lVar23 = lVar23 + 0x18, lVar23 != 0x3b8) {
LAB_00106d49:
    if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) == '\x13') {
      cVar13 = '\x13';
      goto LAB_00106fac;
    }
  }
  cVar13 = '\'';
LAB_00106fac:
  lVar23 = 0x10;
  do {
    if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) == cVar13) {
      uVar17 = *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar23);
      uVar21 = *(uint *)(&action_s::NameMap + lVar23);
      lVar23 = *in_FS_OFFSET;
      uVar26 = 0x9c;
      goto LAB_00107008;
    }
    lVar23 = lVar23 + 0x18;
  } while (lVar23 != 0x3b8);
  goto LAB_00106fc3;
  while (lVar23 = lVar23 + 0x18, lVar23 != 0x3b8) {
LAB_001069e4:
    if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) == '\x13') {
      cVar13 = '\x13';
      goto LAB_00106ce4;
    }
  }
  cVar13 = '\'';
LAB_00106ce4:
  lVar23 = 0x10;
LAB_00106ce9:
  if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) != cVar13)
  goto code_r0x00106cee;
  uVar17 = *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar23);
  uVar21 = *(uint *)(&action_s::NameMap + lVar23);
  lVar23 = *in_FS_OFFSET;
  uVar26 = 0x9f;
LAB_00107008:
  iVar9 = snprintf((char *)(lVar23 + -0x700),0x400,"%.*s (file %s, line %d): ",(ulong)uVar21,uVar17,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                   ,uVar26);
  local_90 = "Repeated dimensions on level %d\n";
  snprintf((char *)(lVar23 + -0x700) + iVar9,0x400 - (long)iVar9,"Repeated dimensions on level %d\n"
          );
  local_98 = 0x10113;
  goto LAB_00106f7b;
code_r0x00106cee:
  lVar23 = lVar23 + 0x18;
  if (lVar23 == 0x3b8) goto LAB_00106fc3;
  goto LAB_00106ce9;
  while (lVar23 = lVar23 + 0x18, lVar23 != 0x3b8) {
LAB_00106cc4:
    if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) == '\x1e') {
      cVar13 = '\x1e';
      goto LAB_00106eed;
    }
  }
  cVar13 = '\'';
LAB_00106eed:
  lVar23 = 0x10;
LAB_00106ef2:
  if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) != cVar13)
  goto code_r0x00106ef7;
  lVar12 = *in_FS_OFFSET;
  iVar9 = snprintf((char *)(lVar12 + -0x700),0x400,"%.*s (file %s, line %d): ",
                   (ulong)*(uint *)(&action_s::NameMap + lVar23),
                   *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar23),
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                   ,0x99);
  lVar23 = (long)iVar9;
  pcVar24 = (char *)(lVar12 + -0x700) + lVar23;
  local_90 = ": or | needs to be followed by a dimension in the indexing template\n";
LAB_00106f6c:
  snprintf(pcVar24,0x400 - lVar23,local_90);
LAB_00106f76:
  local_98 = 0x1011e;
  goto LAB_00106f7b;
code_r0x00106ef7:
  lVar23 = lVar23 + 0x18;
  if (lVar23 == 0x3b8) goto LAB_00106fc3;
  goto LAB_00106ef2;
  while (lVar23 = lVar23 + 0x18, lVar23 != 0x3b8) {
LAB_00106a28:
    if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) == '\x05') {
      cVar13 = '\x05';
      goto LAB_00106d69;
    }
  }
  cVar13 = '\'';
LAB_00106d69:
  lVar23 = 0x10;
LAB_00106d6e:
  if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) != cVar13)
  goto code_r0x00106d73;
  lVar12 = *in_FS_OFFSET;
  iVar10 = snprintf((char *)(lVar12 + -0x700),0x400,"%.*s (file %s, line %d): ",
                    (ulong)*(uint *)(&action_s::NameMap + lVar23),
                    *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar23),
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                    ,0xb6);
  lVar23 = 0x3f;
  if ((long)iVar9 != 0) {
    for (; (ulong)(long)iVar9 >> lVar23 == 0; lVar23 = lVar23 + -1) {
    }
  }
  bVar3 = *pbVar11;
  lVar14 = (long)iVar10;
  pcVar24 = (char *)(lVar12 + -0x700) + lVar14;
  lVar12 = 0x3f;
  if (uVar19 != 0) {
    for (; uVar19 >> lVar12 == 0; lVar12 = lVar12 + -1) {
    }
  }
  uVar21 = (-(uint)(iVar9 == 0) | (uint)lVar23) - (-(uint)(iVar18 == 0) | (uint)lVar12);
  local_90 = "Dimension %c needs to appear %d more times in the indexing template\n";
  goto LAB_00106ecc;
code_r0x00106d73:
  lVar23 = lVar23 + 0x18;
  if (lVar23 == 0x3b8) goto LAB_00106fc3;
  goto LAB_00106d6e;
  while (lVar23 = lVar23 + 0x18, lVar23 != 0x3b8) {
LAB_00106a6c:
    if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) == '\x05') {
      cVar13 = '\x05';
      goto LAB_00106e1e;
    }
  }
  cVar13 = '\'';
LAB_00106e1e:
  lVar23 = 0x10;
  do {
    if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar23) == cVar13) {
      lVar12 = *in_FS_OFFSET;
      iVar10 = snprintf((char *)(lVar12 + -0x700),0x400,"%.*s (file %s, line %d): ",
                        (ulong)*(uint *)(&action_s::NameMap + lVar23),
                        *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar23),
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                        ,0xbb);
      bVar3 = *pbVar11;
      lVar14 = (long)iVar10;
      pcVar24 = (char *)(lVar12 + -0x700) + lVar14;
      lVar23 = 0x3f;
      if (uVar19 != 0) {
        for (; uVar19 >> lVar23 == 0; lVar23 = lVar23 + -1) {
        }
      }
      lVar12 = 0x3f;
      if ((long)iVar9 != 0) {
        for (; (ulong)(long)iVar9 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      uVar21 = (-(uint)(iVar18 == 0) | (uint)lVar23) - (-(uint)(iVar9 == 0) | (uint)lVar12);
      local_90 = "Dimension %c needs to appear %d fewer times in the indexing template\n";
LAB_00106ecc:
      snprintf(pcVar24,0x400 - lVar14,local_90,(ulong)(uint)(int)(char)bVar3,(ulong)uVar21);
      local_98 = 0x10105;
LAB_00106f7b:
      *(undefined4 *)(lVar22 + -0xfc) = 199;
      *(char **)(lVar16 + -0x2f8) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
      ;
      goto LAB_00106f92;
    }
    lVar23 = lVar23 + 0x18;
  } while (lVar23 != 0x3b8);
LAB_00106fc3:
  __assert_fail("It != End(EnumS.NameMap)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/../idx2Common.h"
                ,0x38,"stref idx2::ToString(idx2_err_code)");
}

Assistant:

error<idx2_err_code>
Finalize(idx2_file_v2* Idx2)
{
  idx2_PropagateIfError(CheckDimensions(Idx2));
  idx2_PropagateIfError(ParseIndexingTemplate(Idx2));
  /* print the parsed indexing template */

  return idx2_Error(idx2_err_code::NoError);
}